

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O1

void __thiscall
QPDFArgParser::QPDFArgParser(QPDFArgParser *this,int argc,char **argv,char *progname_env)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  Members *this_00;
  OptionEntry *pOVar3;
  string local_d8;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  this_00 = (Members *)operator_new(0x290);
  Members::Members(this_00,argc,argv,progname_env);
  (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<QPDFArgParser::Members*>
            (&(this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,this_00);
  peVar2 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar2->option_table = &peVar2->help_option_table;
  std::__cxx11::string::_M_replace
            ((ulong)&peVar2->option_table_name,0,
             (char *)(peVar2->option_table_name)._M_string_length,0x26f501);
  paVar1 = &local_d8.field_2;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"help","");
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x18);
  *(code **)local_58._M_unused._0_8_ = argHelp;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(QPDFArgParser **)((long)local_58._M_unused._0_8_ + 0x10) = this;
  pcStack_40 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::_Bind<std::_Mem_fn<void_(QPDFArgParser::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_(QPDFArgParser_*,_std::_Placeholder<1>)>_>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::_Bind<std::_Mem_fn<void_(QPDFArgParser::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_(QPDFArgParser_*,_std::_Placeholder<1>)>_>
             ::_M_manager;
  addChoices(this,&local_d8,(param_arg_handler_t *)&local_58,false,
             &PTR_anon_var_dwarf_24f8e0_002f0250);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"help","");
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_78._M_unused._M_object = operator_new(0x18);
  *(code **)local_78._M_unused._0_8_ = invalidHelpArg;
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = 0;
  *(QPDFArgParser **)((long)local_78._M_unused._0_8_ + 0x10) = this;
  pcStack_60 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::_Bind<std::_Mem_fn<void_(QPDFArgParser::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_(QPDFArgParser_*,_std::_Placeholder<1>)>_>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::_Bind<std::_Mem_fn<void_(QPDFArgParser::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_(QPDFArgParser_*,_std::_Placeholder<1>)>_>
             ::_M_manager;
  addInvalidChoiceHandler(this,&local_d8,(param_arg_handler_t *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"completion-bash","");
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_98._M_unused._M_object = operator_new(0x18);
  *(code **)local_98._M_unused._0_8_ = argCompletionBash;
  *(undefined8 *)((long)local_98._M_unused._0_8_ + 8) = 0;
  *(QPDFArgParser **)((long)local_98._M_unused._0_8_ + 0x10) = this;
  pcStack_80 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_(QPDFArgParser::*)()>_(QPDFArgParser_*)>_>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_(QPDFArgParser::*)()>_(QPDFArgParser_*)>_>
             ::_M_manager;
  pOVar3 = registerArg(this,&local_d8);
  pOVar3->parameter_needed = false;
  std::function<void_()>::operator=(&pOVar3->bare_arg_handler,(function<void_()> *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"completion-zsh","");
  local_a8 = (code *)0x0;
  pcStack_a0 = (code *)0x0;
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_b8._M_unused._M_object = operator_new(0x18);
  *(code **)local_b8._M_unused._0_8_ = argCompletionZsh;
  *(undefined8 *)((long)local_b8._M_unused._0_8_ + 8) = 0;
  *(QPDFArgParser **)((long)local_b8._M_unused._0_8_ + 0x10) = this;
  pcStack_a0 = std::
               _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_(QPDFArgParser::*)()>_(QPDFArgParser_*)>_>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(),_std::_Bind<std::_Mem_fn<void_(QPDFArgParser::*)()>_(QPDFArgParser_*)>_>
             ::_M_manager;
  pOVar3 = registerArg(this,&local_d8);
  pOVar3->parameter_needed = false;
  std::function<void_()>::operator=(&pOVar3->bare_arg_handler,(function<void_()> *)&local_b8);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  peVar2 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar2->option_table = &peVar2->main_option_table;
  std::__cxx11::string::_M_replace
            ((ulong)&peVar2->option_table_name,0,
             (char *)(peVar2->option_table_name)._M_string_length,0x2654b8);
  return;
}

Assistant:

QPDFArgParser::QPDFArgParser(int argc, char const* const argv[], char const* progname_env) :
    m(new Members(argc, argv, progname_env))
{
    selectHelpOptionTable();
    char const* help_choices[] = {"all", nullptr};
    // More help choices are added dynamically.
    addChoices("help", bindParam(&QPDFArgParser::argHelp, this), false, help_choices);
    addInvalidChoiceHandler("help", bindParam(&QPDFArgParser::invalidHelpArg, this));
    addBare("completion-bash", bindBare(&QPDFArgParser::argCompletionBash, this));
    addBare("completion-zsh", bindBare(&QPDFArgParser::argCompletionZsh, this));
    selectMainOptionTable();
}